

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Activate(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  DObject *this;
  char *pcVar2;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_004325cc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004325b3:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004325cc:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x12f5,
                  "int AF_AActor_Activate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_0043255e;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004325cc;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_004325b3;
LAB_0043255e:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_004325eb;
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    this_00 = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (this_00 != (DObject *)0x0) {
        bVar1 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "activator == NULL || activator->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004325eb;
        }
        goto LAB_004325a0;
      }
    }
    else if (this_00 != (DObject *)0x0) goto LAB_004325bc;
    this_00 = (DObject *)0x0;
LAB_004325a0:
    (*this->_vptr_DObject[0xd])(this,this_00);
    return 0;
  }
LAB_004325bc:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004325eb:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x12f6,"int AF_AActor_Activate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Activate)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(activator, AActor);
	self->Activate(activator);
	return 0;
}